

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O0

void test_read_format_rar_compress_best(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a_00;
  char *pcVar4;
  time_t tVar5;
  long lVar6;
  la_int64_t lVar7;
  la_ssize_t lVar8;
  archive *a;
  archive_entry *ae;
  char file2_test_txt [21];
  undefined1 local_4f28 [4];
  int file2_size;
  char file2_buff [20];
  undefined1 local_4f08 [8];
  char file1_test_txt [56];
  undefined1 local_4ec8 [4];
  int file1_size;
  char file1_buff [20111];
  char reffile [39];
  
  memcpy(file1_buff + 0x4e88,"test_read_format_rar_compress_best.rar",0x27);
  file1_test_txt[0x34] = -0x71;
  file1_test_txt[0x35] = 'N';
  file1_test_txt[0x36] = '\0';
  file1_test_txt[0x37] = '\0';
  memcpy(local_4f08,"<P STYLE=\"margin-bottom: 0in\"><BR>\n</P>\n</BODY>\n</HTML>",0x38);
  stack0xffffffffffffb0d4 = 0x14;
  ae = (archive_entry *)0x7865742074736574;
  file2_test_txt[0] = 't';
  file2_test_txt[1] = ' ';
  file2_test_txt[2] = 'd';
  file2_test_txt[3] = 'o';
  file2_test_txt[4] = 'c';
  file2_test_txt[5] = 'u';
  file2_test_txt[6] = 'm';
  file2_test_txt[7] = 'e';
  file2_test_txt[8] = 'n';
  file2_test_txt[9] = 't';
  file2_test_txt[10] = '\r';
  file2_test_txt[0xb] = '\n';
  file2_test_txt[0xc] = '\0';
  extract_reference_file(file1_buff + 0x4e88);
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɣ',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɤ',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɥ',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a_00);
  wVar2 = archive_read_open_filename(a_00,file1_buff + 0x4e88,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɦ',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, reffile, 10240)",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɩ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ɪ',"LibarchiveAddingTest.html","\"LibarchiveAddingTest.html\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɫ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɬ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a_00);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɭ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a_00);
  lVar6 = (long)(int)file1_test_txt._52_4_;
  lVar7 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɮ',lVar6,"file1_size",lVar7,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɯ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɰ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɱ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
  lVar6 = (long)(int)file1_test_txt._52_4_;
  lVar8 = archive_read_data((archive *)a_00,local_4ec8,(long)(int)file1_test_txt._52_4_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɲ',(uint)(lVar6 == lVar8),
                   "file1_size == archive_read_data(a, file1_buff, file1_size)",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɴ',file1_test_txt + (long)(int)file1_test_txt._52_4_ + 1,
                      "&file1_buff[file1_size - sizeof(file1_test_txt) + 1]",local_4f08,
                      "file1_test_txt",0x37,"sizeof(file1_test_txt) - 1",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɷ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ɸ',"testlink","\"testlink\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɹ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɺ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a_00);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ɻ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a_00);
  lVar7 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɼ',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɽ',0xa1ff,"41471",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɾ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ɿ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
  pcVar4 = archive_entry_symlink((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ʀ',"LibarchiveAddingTest.html","\"LibarchiveAddingTest.html\"",pcVar4,
             "archive_entry_symlink(ae)",(void *)0x0,L'\0');
  lVar8 = archive_read_data((archive *)a_00,local_4ec8,0x1e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʁ',0,"0",lVar8,"archive_read_data(a, file1_buff, 30)",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʄ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ʅ',"testdir/test.txt","\"testdir/test.txt\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʆ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʇ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a_00);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʈ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a_00);
  lVar6 = (long)stack0xffffffffffffb0d4;
  lVar7 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʉ',lVar6,"file2_size",lVar7,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʊ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʋ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʌ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
  lVar6 = (long)stack0xffffffffffffb0d4;
  lVar8 = archive_read_data((archive *)a_00,local_4f28,(long)stack0xffffffffffffb0d4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʍ',(uint)(lVar6 == lVar8),
                   "file2_size == archive_read_data(a, file2_buff, file2_size)",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʏ',file2_test_txt + (long)(stack0xffffffffffffb0d4 + 1) + 3,
                      "&file2_buff[file2_size + 1 - sizeof(file2_test_txt)]",&ae,"file2_test_txt",
                      0x14,"sizeof(file2_test_txt) - 1",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʒ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ʔ',"testdir/LibarchiveAddingTest.html","\"testdir/LibarchiveAddingTest.html\"",
             pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʕ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʖ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a_00);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʗ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a_00);
  lVar6 = (long)(int)file1_test_txt._52_4_;
  lVar7 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʘ',lVar6,"file1_size",lVar7,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʙ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʚ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʛ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
  lVar6 = (long)(int)file1_test_txt._52_4_;
  lVar8 = archive_read_data((archive *)a_00,local_4ec8,(long)(int)file1_test_txt._52_4_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʜ',(uint)(lVar6 == lVar8),
                   "file1_size == archive_read_data(a, file1_buff, file1_size)",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʞ',file1_test_txt + (long)(int)file1_test_txt._52_4_ + 1,
                      "&file1_buff[file1_size - sizeof(file1_test_txt) + 1]",local_4f08,
                      "file1_test_txt",0x37,"sizeof(file1_test_txt) - 1",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʡ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ʢ',"testdir","\"testdir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʣ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʤ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a_00);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʥ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a_00);
  lVar7 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʦ',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʧ',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʨ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʩ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʬ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ʭ',"testemptydir","\"testemptydir\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʮ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a_00);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʯ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a_00);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʰ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a_00);
  lVar7 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʱ',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʲ',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʳ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʴ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʷ',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_file_count((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʸ',6,"6",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʹ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ʺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_compress_best)
{
  const char reffile[] = "test_read_format_rar_compress_best.rar";
  char file1_buff[20111];
  int file1_size = sizeof(file1_buff);
  const char file1_test_txt[] = "<P STYLE=\"margin-bottom: 0in\"><BR>\n"
                                "</P>\n"
                                "</BODY>\n"
                                "</HTML>";
  char file2_buff[20];
  int file2_size = sizeof(file2_buff);
  const char file2_test_txt[] = "test text document\r\n";
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("LibarchiveAddingTest.html", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file1_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(file1_size == archive_read_data(a, file1_buff, file1_size));
  assertEqualMem(&file1_buff[file1_size - sizeof(file1_test_txt) + 1],
                 file1_test_txt, sizeof(file1_test_txt) - 1);

    /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testlink", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41471, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertEqualString("LibarchiveAddingTest.html", archive_entry_symlink(ae));
  assertEqualIntA(a, 0, archive_read_data(a, file1_buff, 30));

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file2_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(file2_size == archive_read_data(a, file2_buff, file2_size));
  assertEqualMem(&file2_buff[file2_size + 1 - sizeof(file2_test_txt)],
                 file2_test_txt, sizeof(file2_test_txt) - 1);

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/LibarchiveAddingTest.html",
                    archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file1_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(file1_size == archive_read_data(a, file1_buff, file1_size));
  assertEqualMem(&file1_buff[file1_size - sizeof(file1_test_txt) + 1],
                 file1_test_txt, sizeof(file1_test_txt) - 1);

  /* Fifth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Sixth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testemptydir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(6, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}